

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_initialize(void)

{
  char *pcVar1;
  int *piVar2;
  undefined1 (*pauVar3) [16];
  proc_list_t *ppVar4;
  undefined1 auVar5 [16];
  int iVar6;
  global_array_t *pgVar7;
  int *piVar8;
  Integer IVar9;
  Integer IVar10;
  Integer IVar11;
  Integer count;
  Integer *list;
  MPI_Comm poVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Integer i;
  Integer j;
  long local_40;
  Integer local_38;
  
  if (GAinitialized != '\0') {
    return;
  }
  if (ARMCIinitialized != '\0') goto LAB_0015ebae;
  if (GA_memory_limited == '\x01') {
    ARMCI_Set_shm_limit(GA_total_memory);
  }
  if (_ga_initialize_c == 0) {
    if (_ga_initialize_f != 0) {
      piVar8 = (int *)malloc(4);
      _ga_argc = piVar8;
      _ga_argv = (char ***)malloc(8);
      if (piVar8 == (int *)0x0) {
        pnga_error("malloc argc failed",1);
        piVar8 = _ga_argc;
      }
      ga_f2c_get_cmd_args(piVar8,_ga_argv);
      goto LAB_0015eb86;
    }
    pnga_error("pnga_initialize called outside of C or F APIs",1);
  }
  else if (_ga_initialize_args == 0) {
    ARMCI_Init();
  }
  else {
LAB_0015eb86:
    ARMCI_Init_args(_ga_argc,_ga_argv);
  }
  ARMCIinitialized = '\x01';
LAB_0015ebae:
  GA_Default_Proc_Group = -1;
  pgVar7 = (global_array_t *)malloc(0x1b40000);
  _ga_main_data_structure = pgVar7;
  _proc_list_main_data_structure = (proc_list_t *)malloc(0x140000);
  if (pgVar7 == (global_array_t *)0x0) {
    pnga_error("ga_init:malloc ga failed",0);
  }
  if (_proc_list_main_data_structure == (proc_list_t *)0x0) {
    pnga_error("ga_init:malloc proc_list failed",0);
  }
  GA = _ga_main_data_structure;
  lVar13 = 0;
  lVar15 = 0;
  PGRP_LIST = _proc_list_main_data_structure;
  do {
    pcVar1 = GA->name + lVar15 + -0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1 = GA->name + lVar15 + -8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)((long)GA->old_nblock + lVar15 + -0x38) = 0;
    *(undefined8 *)((long)GA->old_nblock + lVar15 + -0x18) = 0;
    pgVar7 = GA;
    *(undefined4 *)((long)GA->old_nblock + lVar15 + -0x10) = 0;
    pcVar1 = pgVar7->mem_dev + lVar15 + -4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined4 *)((long)pgVar7->dims + lVar15 + -0x28) = 0;
    *(int *)((long)pgVar7->block_dims + lVar15 + -0x18) = GA_Init_Proc_Group;
    pcVar1 = pgVar7->mem_dev + lVar15 + 0x20;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined8 *)((long)&PGRP_LIST->map_proc_list + lVar13) = 0;
    *(undefined8 *)((long)&PGRP_LIST->inv_map_proc_list + lVar13) = 0;
    *(undefined4 *)((long)&PGRP_LIST->actv + lVar13) = 0;
    lVar15 = lVar15 + 0x368;
    lVar13 = lVar13 + 0x28;
  } while (lVar15 != 0x1b40000);
  local_40 = 0x8000;
  GAstat.numcre = 0;
  GAstat.numdes = 0;
  GAstat.numget = 0;
  GAstat.numput = 0;
  GAstat.numacc = 0;
  GAstat.numsca = 0;
  GAstat.numgat = 0;
  GAstat.numrdi = 0;
  GAstat.numser = 0;
  GAstat.curmem = 0;
  GAstat.maxmem = 0;
  GAstat.numget_procs = 0;
  GAstat.numput_procs = 0;
  GAstat.numacc_procs = 0;
  GAstat.numsca_procs = 0;
  GAstat.numgat_procs = 0;
  gai_nb_init();
  iVar6 = armci_msg_nproc();
  GAnproc = (Integer)iVar6;
  mapALL = (Integer *)malloc(GAnproc * 8 + 0x30);
  iVar6 = armci_msg_me();
  GAme = (Integer)iVar6;
  if ((iVar6 < 0) || (GAnproc < GAme)) {
    pnga_error("ga_init:message-passing initialization problem: my ID=",GAme);
  }
  lVar13 = 0;
  armci_msg_me();
  gai_init_onesided();
  if (0 < _max_global_array) {
    piVar8 = &GA->actv;
    lVar13 = 0;
    do {
      *piVar8 = 0;
      lVar13 = lVar13 + 1;
      piVar8 = piVar8 + 0xda;
    } while (lVar13 < _max_global_array);
    if (_max_global_array < 1) {
      lVar13 = 0;
    }
    else {
      piVar8 = &GA->actv_handle;
      lVar13 = 0;
      do {
        *piVar8 = 0;
        lVar13 = lVar13 + 1;
        piVar8 = piVar8 + 0xda;
      } while (lVar13 < _max_global_array);
    }
  }
  IVar9 = GAnproc;
  local_40 = lVar13;
  piVar8 = (int *)malloc(GAnproc * 8);
  ppVar4 = PGRP_LIST;
  PGRP_LIST->map_proc_list = piVar8;
  ppVar4->inv_map_proc_list = piVar8 + IVar9;
  if (0 < IVar9) {
    memset(piVar8,0xff,IVar9 << 2);
    memset(piVar8 + IVar9,0xff,IVar9 << 2);
  }
  IVar9 = pnga_cluster_nodeid();
  IVar10 = pnga_cluster_nprocs(IVar9);
  IVar11 = pnga_cluster_procid(IVar9,0);
  ppVar4 = PGRP_LIST;
  ppVar4->actv = 1;
  ppVar4->parent = -1;
  ppVar4->map_nproc = (int)IVar10;
  ppVar4->mirrored = 1;
  if (0 < IVar10) {
    piVar8 = ppVar4->map_proc_list;
    piVar2 = ppVar4->inv_map_proc_list;
    lVar13 = 0;
    do {
      piVar8[IVar11 + lVar13] = (int)lVar13;
      piVar2[lVar13] = (int)IVar11 + (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (IVar10 != lVar13);
  }
  lVar13 = (long)GA_World_Proc_Group;
  local_40 = IVar10;
  IVar11 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(lVar13,IVar11,&local_40,1,"max");
  lVar13 = (long)GA_World_Proc_Group;
  local_38 = IVar10;
  IVar11 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(lVar13,IVar11,&local_38,1,"min");
  if (local_40 == local_38) {
    count = pnga_cluster_nnodes();
    list = (Integer *)malloc(count * 8);
    IVar11 = GAme;
    IVar9 = pnga_cluster_procid(IVar9,0);
    auVar5 = _DAT_001b17c0;
    local_40 = 0;
    if (0 < count) {
      lVar13 = count + -1;
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = IVar11 - IVar9;
      uVar14 = 0;
      auVar16 = auVar16 ^ _DAT_001b17c0;
      auVar17 = _DAT_001b17f0;
      do {
        auVar18 = auVar17 ^ auVar5;
        if ((bool)(~(auVar18._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar18._0_4_ ||
                    auVar16._4_4_ < auVar18._4_4_) & 1)) {
          list[uVar14] = lVar13;
        }
        if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
            auVar18._12_4_ <= auVar16._12_4_) {
          list[uVar14 + 1] = IVar10 + lVar13;
        }
        uVar14 = uVar14 + 2;
        lVar15 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar15 + 2;
        lVar13 = lVar13 + IVar10 * 2;
        local_40 = count;
      } while ((count + 1U & 0xfffffffffffffffe) != uVar14);
    }
    _mirror_gop_grp = pnga_pgroup_create(list,count);
    free(list);
  }
  else {
    _mirror_gop_grp = (Integer)GA_World_Proc_Group;
  }
  GA_Update_Flags = (int **)malloc(GAnproc << 3);
  if (GA_Update_Flags == (int **)0x0) {
    pnga_error("ga_init: Failed to initialize GA_Update_Flags",(long)(int)GAme);
  }
  iVar6 = ARMCI_Malloc(GA_Update_Flags,0x38);
  if (iVar6 != 0) {
    pnga_error("ga_init:Failed to initialize memory for update flags",GAme);
  }
  if (GA_Update_Flags[GAme] == (int *)0x0) {
    pnga_error("ga_init:ARMCIMalloc failed",GAme);
  }
  GA_Update_Signal = (int *)ARMCI_Malloc_local(4);
  pauVar3 = (undefined1 (*) [16])GA_Update_Flags[GAme];
  *pauVar3 = (undefined1  [16])0x0;
  pauVar3[1] = (undefined1  [16])0x0;
  pauVar3[2] = (undefined1  [16])0x0;
  *(undefined8 *)pauVar3[3] = 0;
  local_40 = 0xe;
  MA_set_error_callback(ARMCI_Error);
  GAinitialized = 1;
  poVar12 = GA_MPI_Comm_pgroup(-1);
  MPI_Comm_dup(poVar12,&GA_MPI_World_comm_dup);
  sai_init_sparse_arrays();
  return;
}

Assistant:

void pnga_initialize()
{
    Integer  i, j,nproc, nnode, zero;
    int bytes;
    GA_Internal_Threadsafe_Lock();
#ifdef MSG_COMMS_MPI
        MPI_Comm comm;
#endif

    if(GAinitialized)
    {
        GA_Internal_Threadsafe_Unlock();
        return;
    }

#if HAVE_ARMCI_INITIALIZED_FUNCTION
    if (!ARMCI_Initialized())
#else
    if (!ARMCIinitialized)
#endif
    {
        /* assure that GA will not alocate more shared memory than specified */
        if(GA_memory_limited) ARMCI_Set_shm_limit(GA_total_memory);
        if (_ga_initialize_c) {
            if (_ga_initialize_args) {
                ARMCI_Init_args(_ga_argc, _ga_argv);
            }
            else {
                ARMCI_Init();
            }
        }
        else if (_ga_initialize_f) {
            _ga_argc = malloc(sizeof(int));
            _ga_argv = malloc(sizeof(char**));
            if (!_ga_argc) pnga_error("malloc argc failed",1);
            ga_f2c_get_cmd_args(_ga_argc, _ga_argv);
            ARMCI_Init_args(_ga_argc, _ga_argv);
        }
        else {
            pnga_error("pnga_initialize called outside of C or F APIs",1);
        }
        ARMCIinitialized = 1;
    }
    
    GA_Default_Proc_Group = -1;
    /* zero in pointers in GA array */
    _ga_main_data_structure
       = (global_array_t *)malloc(sizeof(global_array_t)*MAX_ARRAYS);
    _proc_list_main_data_structure
       = (proc_list_t *)malloc(sizeof(proc_list_t)*MAX_ARRAYS);
    if(!_ga_main_data_structure)
       pnga_error("ga_init:malloc ga failed",0);
    if(!_proc_list_main_data_structure)
       pnga_error("ga_init:malloc proc_list failed",0);
    GA = _ga_main_data_structure;
    PGRP_LIST = _proc_list_main_data_structure;
    for(i=0;i<MAX_ARRAYS; i++) {
       GA[i].ptr  = (char**)0;
       GA[i].mapc = (C_Integer*)0;
       GA[i].rstrctd_list = (C_Integer*)0;
       GA[i].rank_rstrctd = (C_Integer*)0;
       GA[i].property = NO_PROPERTY;
       GA[i].mem_dev_set = 0;
#ifdef ENABLE_CHECKPOINT
       GA[i].record_id = 0;
#endif
       GA[i].actv = 0;
       GA[i].p_handle = GA_Init_Proc_Group;
       GA[i].overlay = 0;
       PGRP_LIST[i].map_proc_list = (int*)0;
       PGRP_LIST[i].inv_map_proc_list = (int*)0;
       PGRP_LIST[i].actv = 0;
    }

    bzero(&GAstat,sizeof(GAstat));

    /* initialize some data structures used in non-blocking communication */
    gai_nb_init();

    GAnproc = (Integer)armci_msg_nproc();

    /* Allocate arrays used by library */
    mapALL = (Integer*)malloc((GAnproc+MAXDIM-1)*sizeof(Integer*));

    GAme = (Integer)armci_msg_me();
    if(GAme<0 || GAme>GAnproc) 
       pnga_error("ga_init:message-passing initialization problem: my ID=",GAme);

    MPme= (Integer)armci_msg_me();

    gai_init_onesided();

    /* set activity status for all arrays to inactive */
    for(i=0;i<_max_global_array;i++)GA[i].actv=0;
    for(i=0;i<_max_global_array;i++)GA[i].actv_handle=0;

    /* Create proc list for mirrored arrays */
    PGRP_LIST[0].map_proc_list = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[0].inv_map_proc_list = PGRP_LIST[0].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].inv_map_proc_list[i] = -1;
    nnode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(nnode);
    zero = 0;
    j = pnga_cluster_procid(nnode, zero);
    PGRP_LIST[0].parent = -1;
    PGRP_LIST[0].actv = 1;
    PGRP_LIST[0].map_nproc = nproc;
    PGRP_LIST[0].mirrored = 1;
    for (i=0; i<nproc; i++) {
       PGRP_LIST[0].map_proc_list[i+j] = i;
       PGRP_LIST[0].inv_map_proc_list[i] = i+j;
    }

    /* Set up group for doing cluster merge. Start by checking if
     * number of procs per node is the same for all nodes */
    i = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&i,1,"max");
    j = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&j,1,"min");
    if (i == j) {
      /* construct a group that containing all processors with the same local
       * proc ID across all nodes in the system */
      Integer numnodes = pnga_cluster_nnodes();
      Integer *nodelist = (Integer*)malloc(numnodes*sizeof(Integer));
      Integer myproc = GAme-pnga_cluster_procid(nnode,zero);
      for (i=0; i<numnodes; i++) {
        nodelist[i] = i*nproc+myproc;
      }
      _mirror_gop_grp = pnga_pgroup_create(nodelist,numnodes);
      free(nodelist);
    } else {
      _mirror_gop_grp = GA_World_Proc_Group;
    }



    /* Allocate memory for update flags and signal*/
    bytes = 2*MAXDIM*sizeof(int);
    GA_Update_Flags = (int**)malloc(GAnproc*sizeof(void*));
    if (!GA_Update_Flags)
      pnga_error("ga_init: Failed to initialize GA_Update_Flags",(int)GAme);
    if (ARMCI_Malloc((void**)GA_Update_Flags, (armci_size_t) bytes))
      pnga_error("ga_init:Failed to initialize memory for update flags",GAme);
    if(GA_Update_Flags[GAme]==NULL)pnga_error("ga_init:ARMCIMalloc failed",GAme);

    bytes = sizeof(int);
    GA_Update_Signal = ARMCI_Malloc_local((armci_size_t) bytes);

    /* Zero update flags */
    for (i=0; i<2*MAXDIM; i++) {
		GA_Update_Flags[GAme][i] = 0;
	}

    /* set MA error function */
    MA_set_error_callback(ARMCI_Error);

    GAinitialized = 1;

#ifdef PROFILE_OLD 
    ga_profile_init();
#endif
#ifdef ENABLE_CHECKPOINT
    {
    Integer tmplist[1000];
    Integer tmpcount;
    tmpcount = GAnproc-ga_spare_procs;
    for(i=0;i<tmpcount;i++)
            tmplist[i]=i;
    ga_group_is_for_ft=1;
    GA_Default_Proc_Group = pnga_pgroup_create(tmplist,tmpcount);
    ga_group_is_for_ft=0;
    if(GAme>=tmpcount)
      ga_irecover(0);
    printf("\n%d:here done with initialize\n",GAme);
                 
    }
#endif
    /* create duplicate of world communicator */
#ifdef MSG_COMMS_MPI
    comm =  GA_MPI_Comm_pgroup(-1);
    MPI_Comm_dup(comm, &GA_MPI_World_comm_dup);
#endif
    sai_init_sparse_arrays();
    GA_Internal_Threadsafe_Unlock();
}